

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

void __thiscall Attribute::Attribute(Attribute *this,Attribute *rhs)

{
  const_iterator __first;
  const_iterator __last;
  vector<AnyType,_std::allocator<AnyType>_> *this_00;
  __normal_iterator<AnyType_*,_std::vector<AnyType,_std::allocator<AnyType>_>_> local_28;
  const_iterator local_20;
  Attribute *local_18;
  Attribute *rhs_local;
  Attribute *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  DerBase::DerBase(&this->super_DerBase);
  (this->super_DerBase)._vptr_DerBase = (_func_int **)&PTR_EncodedSize_001863a0;
  ObjectIdentifier::ObjectIdentifier(&this->attrType,&local_18->attrType);
  this_00 = &this->attrValues;
  std::vector<AnyType,_std::allocator<AnyType>_>::vector(this_00);
  local_28._M_current = (AnyType *)std::vector<AnyType,_std::allocator<AnyType>_>::begin(this_00);
  __gnu_cxx::__normal_iterator<AnyType_const*,std::vector<AnyType,std::allocator<AnyType>>>::
  __normal_iterator<AnyType*>
            ((__normal_iterator<AnyType_const*,std::vector<AnyType,std::allocator<AnyType>>> *)
             &local_20,&local_28);
  __first = std::vector<AnyType,_std::allocator<AnyType>_>::begin(&local_18->attrValues);
  __last = std::vector<AnyType,_std::allocator<AnyType>_>::end(&local_18->attrValues);
  std::vector<AnyType,std::allocator<AnyType>>::
  insert<__gnu_cxx::__normal_iterator<AnyType_const*,std::vector<AnyType,std::allocator<AnyType>>>,void>
            ((vector<AnyType,std::allocator<AnyType>> *)this_00,local_20,
             (__normal_iterator<const_AnyType_*,_std::vector<AnyType,_std::allocator<AnyType>_>_>)
             __first._M_current,
             (__normal_iterator<const_AnyType_*,_std::vector<AnyType,_std::allocator<AnyType>_>_>)
             __last._M_current);
  return;
}

Assistant:

Attribute(const Attribute& rhs) : attrType(rhs.attrType)
	{
		attrValues.insert(attrValues.begin(), rhs.attrValues.begin(), rhs.attrValues.end());
	}